

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_on_grid_test.cpp
# Opt level: O0

void __thiscall
check_computations_of_values_on_different_points::test_method
          (check_computations_of_values_on_different_points *this)

{
  unsigned_short dimension;
  reference pvVar1;
  double dVar2;
  size_type local_140;
  size_t i;
  double dx;
  double x;
  value_type_conflict local_120;
  value_type_conflict local_118;
  value_type_conflict local_110;
  value_type_conflict local_108;
  value_type_conflict local_100;
  value_type_conflict local_f8;
  value_type_conflict local_f0;
  value_type_conflict local_e8;
  value_type_conflict local_e0;
  undefined1 local_d8 [8];
  vector<double,_std::allocator<double>_> results_level_10;
  value_type_conflict local_b8;
  value_type_conflict local_b0;
  value_type_conflict local_a8;
  value_type_conflict local_a0;
  value_type_conflict local_98;
  value_type_conflict local_90;
  value_type_conflict local_88;
  value_type_conflict local_80 [3];
  value_type_conflict local_68;
  undefined1 local_60 [8];
  vector<double,_std::allocator<double>_> results_level_0;
  Persistence_landscape_on_grid p;
  check_computations_of_values_on_different_points *this_local;
  
  dimension = std::numeric_limits<unsigned_short>::max();
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
            ((Persistence_landscape_on_grid *)
             &results_level_0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"data/file_with_diagram_1",100,dimension);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  local_68 = 0.00997867;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_60,&local_68);
  local_80[0] = 0.0521921;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_60,local_80);
  local_88 = 0.104312;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_60,&local_88);
  local_90 = 0.156432;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_60,&local_90);
  local_98 = 0.208552;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_60,&local_98);
  local_a0 = 0.260672;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_60,&local_a0);
  local_a8 = 0.312792;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_60,&local_a8);
  local_b0 = 0.364912;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_60,&local_b0);
  local_b8 = 0.417032;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_60,&local_b8);
  results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3fdb789e774eebf6;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_60,
             (value_type_conflict *)
             &results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_d8);
  local_e0 = 7.21433e-05;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_d8,&local_e0);
  local_e8 = 0.0422135;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_d8,&local_e8);
  local_f0 = 0.0943335;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_d8,&local_f0);
  local_f8 = 0.146453;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_d8,&local_f8);
  local_100 = 0.198573;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_d8,&local_100);
  local_108 = 0.240715;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_d8,&local_108);
  local_110 = 0.272877;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_d8,&local_110);
  local_118 = 0.324997;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_d8,&local_118);
  local_120 = 0.359232;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_d8,&local_120);
  x = 0.379344;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)local_d8,&x);
  dx = 0.0012321;
  for (local_140 = 0; local_140 != 10; local_140 = local_140 + 1) {
    dVar2 = Gudhi::Persistence_representations::Persistence_landscape_on_grid::
            compute_value_at_a_given_point
                      ((Persistence_landscape_on_grid *)
                       &results_level_0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0,dx);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_60,local_140);
    GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar2,*pvVar1,epsilon);
    dVar2 = Gudhi::Persistence_representations::Persistence_landscape_on_grid::
            compute_value_at_a_given_point
                      ((Persistence_landscape_on_grid *)
                       &results_level_0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,10,dx);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_d8,local_140);
    GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar2,*pvVar1,epsilon);
    dx = dx + 0.05212;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_d8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::~Persistence_landscape_on_grid
            ((Persistence_landscape_on_grid *)
             &results_level_0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_computations_of_values_on_different_points) {
  Persistence_landscape_on_grid p("data/file_with_diagram_1", 100, std::numeric_limits<unsigned short>::max());

  std::vector<double> results_level_0;
  results_level_0.push_back(0.00997867);
  results_level_0.push_back(0.0521921);
  results_level_0.push_back(0.104312);
  results_level_0.push_back(0.156432);
  results_level_0.push_back(0.208552);
  results_level_0.push_back(0.260672);
  results_level_0.push_back(0.312792);
  results_level_0.push_back(0.364912);
  results_level_0.push_back(0.417032);
  results_level_0.push_back(0.429237);

  std::vector<double> results_level_10;
  results_level_10.push_back(7.21433e-05);
  results_level_10.push_back(0.0422135);
  results_level_10.push_back(0.0943335);
  results_level_10.push_back(0.146453);
  results_level_10.push_back(0.198573);
  results_level_10.push_back(0.240715);
  results_level_10.push_back(0.272877);
  results_level_10.push_back(0.324997);
  results_level_10.push_back(0.359232);
  results_level_10.push_back(0.379344);

  double x = 0.0012321;
  double dx = 0.05212;
  for (size_t i = 0; i != 10; ++i) {
    GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.compute_value_at_a_given_point(0, x), results_level_0[i], epsilon);
    GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.compute_value_at_a_given_point(10, x), results_level_10[i], epsilon);
    x += dx;
  }
}